

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadline_timer_service.hpp
# Opt level: O0

size_t __thiscall
asio::detail::
deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::expires_after(deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                *this,implementation_type *impl,duration_type *expiry_time,error_code *ec)

{
  time_type expiry_time_00;
  time_type impl_00;
  size_t sVar1;
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *in_RCX;
  error_code *in_RSI;
  time_type *in_RDI;
  error_code *d;
  
  d = in_RSI;
  expiry_time_00 =
       chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
       ::now();
  impl_00 = chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
            ::add(in_RDI,(duration_type *)d);
  sVar1 = expires_at(in_RCX,(implementation_type *)impl_00.__d.__r,
                     (time_type *)expiry_time_00.__d.__r,in_RSI);
  return sVar1;
}

Assistant:

std::size_t expires_after(implementation_type& impl,
      const duration_type& expiry_time, asio::error_code& ec)
  {
    return expires_at(impl,
        Time_Traits::add(Time_Traits::now(), expiry_time), ec);
  }